

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O3

cbtVector3 __thiscall
cbtBarrelShape::localGetSupportingVertexWithoutMargin(cbtBarrelShape *this,cbtVector3 *vec0)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  cbtVector3 cVar16;
  undefined8 uVar11;
  
  fVar9 = vec0->m_floats[0];
  fVar1 = vec0->m_floats[2];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1)
                           );
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar10 = auVar12._0_4_;
  fVar6 = atanf((vec0->m_floats[1] * this->R_vert) / (fVar10 * this->R_hor));
  fVar2 = this->R_vert;
  fVar7 = sinf(fVar6);
  fVar7 = fVar7 * fVar2;
  fVar2 = this->R_hor;
  fVar8 = cosf(fVar6);
  fVar6 = this->Y_high;
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)fVar6),auVar12);
  fVar2 = fVar8 * fVar2 + this->R_offset;
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar2 * (fVar9 / fVar10))),ZEXT416((uint)fVar7),0x10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar14._4_12_ = SUB1612(auVar5 << 0x40,4);
  auVar14._0_4_ = fVar2 * (fVar1 / fVar10);
  uVar13 = auVar14._0_8_;
  fVar9 = this->R_vert;
  if ((auVar4._0_4_ < fVar9) && (fVar6 < fVar7)) {
    fVar1 = this->R_hor;
    fVar9 = 1.0 - (fVar6 / fVar9) * (fVar6 / fVar9);
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar9 = auVar12._0_4_;
    }
    fVar9 = fVar10 / (fVar1 * fVar9 + this->R_offset);
    auVar4._0_4_ = vec0->m_floats[0] / fVar9;
    auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar12 = vinsertps_avx(auVar4,ZEXT416((uint)this->Y_high),0x10);
    uVar13 = (ulong)(uint)(vec0->m_floats[2] / fVar9);
    fVar9 = this->R_vert;
  }
  uVar11 = auVar12._0_8_;
  fVar1 = *(float *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar3);
  if ((auVar5._0_4_ < fVar9) && (auVar12 = vmovshdup_avx(auVar12), auVar12._0_4_ < fVar1)) {
    fVar2 = this->R_hor;
    fVar9 = 1.0 - (fVar1 / fVar9) * (fVar1 / fVar9);
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
      fVar9 = auVar12._0_4_;
    }
    fVar10 = fVar10 / (fVar2 * fVar9 + this->R_offset);
    auVar15._0_4_ = vec0->m_floats[0] / fVar10;
    auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar12 = vinsertps_avx(auVar15,ZEXT416(*(uint *)&(this->super_cbtConvexInternalShape).
                                                      field_0x44),0x10);
    uVar11 = auVar12._0_8_;
    uVar13 = (ulong)(uint)(vec0->m_floats[2] / fVar10);
  }
  cVar16.m_floats[2] = (cbtScalar)(int)uVar13;
  cVar16.m_floats[3] = (cbtScalar)(int)(uVar13 >> 0x20);
  cVar16.m_floats[0] = (cbtScalar)(int)uVar11;
  cVar16.m_floats[1] = (cbtScalar)(int)((ulong)uVar11 >> 0x20);
  return (cbtVector3)cVar16.m_floats;
}

Assistant:

cbtVector3	cbtBarrelShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	cbtVector3 supVecD;

	// suppport point on the lathed ellipse?
	cbtScalar pY = vec0.y();
	cbtScalar pR = std::sqrt(vec0.z()*vec0.z() + vec0.x()*vec0.x());
	cbtScalar pH = pR;
	cbtScalar dX = vec0.x()/pR;
	cbtScalar dZ = vec0.z()/pR;
	cbtScalar tpar = std::atan((pY*R_vert)/(pH*R_hor));
	cbtScalar sY = R_vert * std::sin(tpar);
	cbtScalar sH = R_hor  * std::cos(tpar);
	cbtScalar sR = sH + R_offset;
	cbtScalar sX = dX * sR;
	cbtScalar sZ = dZ * sR;
	supVec.setValue(sX,sY,sZ);
	cbtScalar len = supVec.length();

	// support point on the top disc?
    if ((std::abs(Y_high) < R_vert) && (supVec.y() > Y_high)) {
        cbtScalar R_high_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_high / R_vert, cbtScalar(2)));
        cbtScalar R_high = R_high_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_high;
        supVecD.setValue(vec0.x() / rad_ratio, Y_high, vec0.z() / rad_ratio);
        supVec = supVecD;
    }
    // support point on the bottom disc?
    if ((std::abs(Y_low) < R_vert) && (supVec.y() < Y_low)) {
        cbtScalar R_low_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_low / R_vert, cbtScalar(2)));
        cbtScalar R_low = R_low_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_low;
        supVecD.setValue(vec0.x() / rad_ratio, Y_low, vec0.z() / rad_ratio);
        supVec = supVecD;
    }

	return supVec;
}